

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# by_all.hpp
# Opt level: O0

tuple<int_&,_int_&>
burst::detail::
by_all_impl<0ul,1ul,burst::front_t,std::tuple<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::_List_iterator<int>,std::_Deque_iterator<int,int&,int*>>>const&,boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::_List_iterator<int>,std::_Deque_iterator<int,int&,int*>>>&>>
          (_Tuple_impl<1UL,_int_&> param_1,front_t *param_2,
          tuple<const_boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_List_iterator<int>,_std::_Deque_iterator<int,_int_&,_int_*>_>_>_&,_boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_List_iterator<int>,_std::_Deque_iterator<int,_int_&,_int_*>_>_>_&>
          *param_3)

{
  iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_List_iterator<int>,_std::_Deque_iterator<int,_int_&,_int_*>_>_>
  *piVar1;
  int *__a1;
  int *__a2;
  _Head_base<0UL,_int_&,_false> extraout_RDX;
  tuple<int_&,_int_&> tVar2;
  tuple<const_boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_List_iterator<int>,_std::_Deque_iterator<int,_int_&,_int_*>_>_>_&,_boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_List_iterator<int>,_std::_Deque_iterator<int,_int_&,_int_*>_>_>_&>
  *t_local;
  front_t *f_local;
  
  piVar1 = std::
           get<0ul,boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::_List_iterator<int>,std::_Deque_iterator<int,int&,int*>>>const&,boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::_List_iterator<int>,std::_Deque_iterator<int,int&,int*>>>&>
                     (param_3);
  __a1 = front_t::operator()(param_2,piVar1);
  piVar1 = std::
           get<1ul,boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::_List_iterator<int>,std::_Deque_iterator<int,int&,int*>>>const&,boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::_List_iterator<int>,std::_Deque_iterator<int,int&,int*>>>&>
                     (param_3);
  __a2 = front_t::operator()(param_2,piVar1);
  std::tuple<int_&,_int_&>::tuple<true,_true>
            ((tuple<int_&,_int_&> *)param_1.super__Head_base<1UL,_int_&,_false>._M_head_impl,__a1,
             __a2);
  tVar2.super__Tuple_impl<0UL,_int_&,_int_&>.super__Head_base<0UL,_int_&,_false>._M_head_impl =
       extraout_RDX._M_head_impl;
  tVar2.super__Tuple_impl<0UL,_int_&,_int_&>.super__Tuple_impl<1UL,_int_&>.
  super__Head_base<1UL,_int_&,_false>._M_head_impl =
       param_1.super__Head_base<1UL,_int_&,_false>._M_head_impl;
  return (tuple<int_&,_int_&>)tVar2.super__Tuple_impl<0UL,_int_&,_int_&>;
}

Assistant:

constexpr decltype(auto)
            by_all_impl (std::index_sequence<Indices...>, UnaryFunction & f, Tuple && t)
        {
            return
                std::tuple
                <
                    invoke_result_t
                    <
                        UnaryFunction &, std::tuple_element_t<Indices, std::decay_t<Tuple>>
                    >...
                >
                (
                    f(std::get<Indices>(std::forward<Tuple>(t)))...
                );
        }